

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

QJsonValue * QJsonValueConstRef::concrete(QJsonValueConstRef self)

{
  long lVar1;
  QJsonValueConstRef r;
  QCborContainerPrivate *this;
  qsizetype idx;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 in_RDX;
  undefined8 extraout_RDX;
  Value *in_RSI;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  QJsonValueConstRef r_00;
  qsizetype index;
  QCborContainerPrivate *d;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 in_stack_ffffffffffffff78;
  QCborValue *v;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  r._8_8_ = in_RDI;
  r.field_0.d = in_stack_ffffffffffffff78.d;
  v = in_RDI;
  this = QJsonPrivate::Value::container(r);
  r_00._8_8_ = extraout_RDX;
  r_00.field_0.d = in_RDX.d;
  idx = QJsonPrivate::Value::indexHelper(in_RSI,r_00);
  QCborContainerPrivate::valueAt(this,idx);
  QJsonPrivate::Value::fromTrustedCbor(v);
  ::QCborValue::~QCborValue(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QJsonValue *)v;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue QJsonValueConstRef::concrete(QJsonValueConstRef self) noexcept
{
    const QCborContainerPrivate *d = QJsonPrivate::Value::container(self);
    qsizetype index = QJsonPrivate::Value::indexHelper(self);
    return QJsonPrivate::Value::fromTrustedCbor(d->valueAt(index));
}